

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::SnailAllocPages<true>
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment)

{
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_00;
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar7;
  char *pcVar8;
  ulong pageCount_00;
  
  iVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x577,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) goto LAB_0070e45f;
    *puVar6 = 0;
  }
  this_00 = &this->emptySegments;
  if ((DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
      (this->emptySegments).
      super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>.next.base !=
      this_00) {
    pPVar7 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                       (this_00);
    pcVar8 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<true>(pPVar7,pageCount);
    if (pcVar8 != (char *)0x0) {
      OnAllocFromNewSegment
                (this,pageCount,pcVar8,&pPVar7->super_SegmentBase<Memory::VirtualAllocWrapper>);
      *pageSegment = pPVar7;
      return pcVar8;
    }
  }
  pcVar8 = TryAllocDecommittedPages<true>(this,pageCount,pageSegment);
  if (pcVar8 != (char *)0x0) {
    FillAllocPages(this,pcVar8,pageCount);
    return pcVar8;
  }
  if (this->maxAllocPageCount < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x5a9,"(maxAllocPageCount >= pageCount)","maxAllocPageCount >= pageCount");
    if (!bVar3) goto LAB_0070e45f;
    *puVar6 = 0;
  }
  uVar5 = this->maxAllocPageCount - pageCount;
  if ((uVar5 == 0) || ((ulong)uVar5 + this->freePageCount <= (ulong)this->maxFreePageCount)) {
    pPVar7 = AddPageSegment(this,this_00);
    if (pPVar7 == (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
      return (char *)0x0;
    }
    pcVar8 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocPages<true>(pPVar7,pageCount);
    if (pcVar8 == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x5d5,"(pages != nullptr)","pages != nullptr");
      if (bVar3) {
        *puVar6 = 0;
        return (char *)0x0;
      }
LAB_0070e45f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    OnAllocFromNewSegment
              (this,pageCount,pcVar8,&pPVar7->super_SegmentBase<Memory::VirtualAllocWrapper>);
  }
  else {
    pPVar7 = AllocPageSegment(&this->decommitSegments,this,false,false,this->enableWriteBarrier);
    if (pPVar7 == (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
      return (char *)0x0;
    }
    pcVar8 = PageSegmentBase<Memory::VirtualAllocWrapper>::AllocDecommitPages<BVStatic<272ul>,true>
                       (pPVar7,pageCount,(BVStatic<272UL>)*&(pPVar7->freePages).data,
                        (BVStatic<272UL>)*&(pPVar7->decommitPages).data);
    if (pcVar8 == (char *)0x0) {
      return (char *)0x0;
    }
    this->decommitPageCount = this->decommitPageCount + (ulong)pPVar7->decommitPageCount;
    FillAllocPages(this,pcVar8,pageCount);
    pageCount_00 = (ulong)pageCount;
    LogRecommitPages(this,pageCount_00);
    this->usedBytes = this->usedBytes + pageCount_00 * 0x1000;
    LOCK();
    totalUsedBytes = totalUsedBytes + pageCount_00 * 0x1000;
    UNLOCK();
    if (maxUsedBytes < totalUsedBytes) {
      maxUsedBytes = totalUsedBytes;
    }
    if (this->memoryData != (PageMemoryData *)0x0) {
      psVar1 = &this->memoryData->allocPageCount;
      *psVar1 = *psVar1 + pageCount_00;
    }
  }
  *pageSegment = pPVar7;
  return pcVar8;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::SnailAllocPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    char * pages = nullptr;
    TPageSegment * newSegment = nullptr;

    if (!emptySegments.Empty())
    {
        newSegment = &emptySegments.Head();

        if (!notPageAligned && !TPageSegment::IsAllocationPageAligned(newSegment->GetAddress(), pageCount))
        {
            newSegment = nullptr;

            // Scan through the empty segments for a segment that can fit this allocation
            FOREACH_DLISTBASE_ENTRY_EDITING(TPageSegment, emptySegment, &this->emptySegments, iter)
            {
                if (TPageSegment::IsAllocationPageAligned(emptySegment.GetAddress(), pageCount))
                {
                    iter.MoveCurrentTo(&this->emptySegments);
                    newSegment = &emptySegment;
                    break;
                }
            }
            NEXT_DLISTBASE_ENTRY_EDITING
        }

        if (newSegment != nullptr)
        {
            pages = newSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                OnAllocFromNewSegment(pageCount, pages, newSegment);
                *pageSegment = newSegment;
                return pages;
            }
        }
    }

    pages = TryAllocDecommittedPages<notPageAligned>(pageCount, pageSegment);
    if (pages != nullptr)
    {
        // TryAllocDecommittedPages may give out a mix of free pages and decommitted pages.
        // Free pages are filled with 0xFE in debug build, so we need to zero them
        // out before giving it out. In release build, free page is already zeroed
        // in ReleasePages
        this->FillAllocPages(pages, pageCount);
        return pages;
    }

    Assert(pages == nullptr);
    Assert(maxAllocPageCount >= pageCount);
    if (maxAllocPageCount != pageCount && (maxFreePageCount < maxAllocPageCount - pageCount + freePageCount))
    {
        // If we exceed the number of max free page count, allocate from a new fully decommit block
        TPageSegment * decommitSegment = AllocPageSegment(
            this->decommitSegments, this, false, false, this->enableWriteBarrier);
        if (decommitSegment == nullptr)
        {
            return nullptr;
        }

        pages = decommitSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount + decommitSegment->GetDecommitPageCount();
#endif
            this->FillAllocPages(pages, pageCount);

            LogRecommitPages(pageCount);
            LogAllocPages(pageCount);

            *pageSegment = decommitSegment;
        }
        return pages;
    }

    // At this point, we haven't been able to allocate either from the
    // decommitted pages, or from the empty segment list, so we'll
    // try allocating a segment. In a page allocator with a pre-reserved segment,
    // we're not allowed to allocate additional segments so return here.
    // Otherwise, add a new segment and allocate from it

    newSegment = AddPageSegment(emptySegments);
    if (newSegment == nullptr)
    {
        return nullptr;
    }

    pages = newSegment->template AllocPages<notPageAligned>(pageCount);
    if (notPageAligned)
    {
        // REVIEW: Is this true for single-chunk allocations too? Are new segments guaranteed to
        // allow for single-chunk allocations to succeed?
        Assert(pages != nullptr);
    }

    if (pages != nullptr)
    {
        OnAllocFromNewSegment(pageCount, pages, newSegment);
        *pageSegment = newSegment;
    }

    return pages;
}